

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_RenderingVenue.cpp
# Opt level: O1

int __thiscall
soul::RenderingVenue::Pimpl::SessionImpl::link(SessionImpl *this,char *__from,char *__to)

{
  _Manager_type p_Var1;
  undefined8 extraout_RAX;
  undefined8 extraout_RAX_00;
  undefined8 uVar2;
  _Any_data _Stack_138;
  _Manager_type local_128;
  undefined1 local_118 [48];
  _Alloc_hider local_e8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_d8;
  vector<soul::SourceFile,_std::allocator<soul::SourceFile>_> local_c8;
  Value local_b0;
  _Any_data local_48;
  _Manager_type local_38;
  _Invoker_type local_30;
  
  local_118._8_4_ = *(undefined4 *)__from;
  local_118._12_4_ = *(undefined4 *)(__from + 4);
  local_118._16_4_ = *(undefined4 *)(__from + 8);
  local_118[0x14] = __from[0xc];
  local_118[0x15] = __from[0xd];
  local_118[0x16] = __from[0xe];
  local_118[0x17] = __from[0xf];
  local_118._24_4_ = *(undefined4 *)(__from + 0x10);
  local_118._28_4_ = *(undefined4 *)(__from + 0x14);
  local_118._32_4_ = *(undefined4 *)(__from + 0x18);
  local_118._36_4_ = *(undefined4 *)(__from + 0x1c);
  local_118._40_8_ = *(undefined8 *)(__from + 0x20);
  local_118._0_8_ = this;
  local_e8._M_p = (pointer)&local_d8;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_e8,*(long *)(__from + 0x28),
             *(long *)(__from + 0x30) + *(long *)(__from + 0x28));
  std::vector<soul::SourceFile,_std::allocator<soul::SourceFile>_>::vector
            (&local_c8,
             (vector<soul::SourceFile,_std::allocator<soul::SourceFile>_> *)(__from + 0x48));
  choc::value::Value::Value(&local_b0,(Value *)(__from + 0x60));
  local_48._M_unused._M_object = (void *)0x0;
  local_48._8_8_ = 0;
  local_38 = (_Manager_type)0x0;
  local_30 = *(_Invoker_type *)(__to + 0x18);
  p_Var1 = *(_Manager_type *)(__to + 0x10);
  if (p_Var1 != (_Manager_type)0x0) {
    local_48._M_unused._0_8_ = (undefined8)*(undefined8 *)__to;
    local_48._8_8_ = *(undefined8 *)(__to + 8);
    __to[0x10] = '\0';
    __to[0x11] = '\0';
    __to[0x12] = '\0';
    __to[0x13] = '\0';
    __to[0x14] = '\0';
    __to[0x15] = '\0';
    __to[0x16] = '\0';
    __to[0x17] = '\0';
    __to[0x18] = '\0';
    __to[0x19] = '\0';
    __to[0x1a] = '\0';
    __to[0x1b] = '\0';
    __to[0x1c] = '\0';
    __to[0x1d] = '\0';
    __to[0x1e] = '\0';
    __to[0x1f] = '\0';
    local_38 = p_Var1;
  }
  std::function<void(std::atomic<int>&)>::
  function<soul::RenderingVenue::Pimpl::SessionImpl::link(soul::BuildSettings_const&,std::function<void(soul::CompileMessageList_const&)>)::_lambda(std::atomic<int>&)_1_,void>
            ((function<void(std::atomic<int>&)> *)_Stack_138._M_pod_data,
             (anon_class_240_3_a0b0fe3a *)local_118);
  TaskThread::Queue::addTask(&this->taskQueue,(TaskFunction *)&_Stack_138);
  if (local_128 != (code *)0x0) {
    (*local_128)(&_Stack_138,&_Stack_138,__destroy_functor);
  }
  if (local_38 != (_Manager_type)0x0) {
    (*local_38)(&local_48,&local_48,__destroy_functor);
  }
  choc::value::Value::~Value(&local_b0);
  std::vector<soul::SourceFile,_std::allocator<soul::SourceFile>_>::~vector(&local_c8);
  uVar2 = extraout_RAX;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_e8._M_p != &local_d8) {
    operator_delete(local_e8._M_p,local_d8._M_allocated_capacity + 1);
    uVar2 = extraout_RAX_00;
  }
  return (int)CONCAT71((int7)((ulong)uVar2 >> 8),1);
}

Assistant:

bool link (const BuildSettings& settings, CompileTaskFinishedCallback linkFinishedCallback) override
        {
            taskQueue.addTask ([this, settings, callback = std::move (linkFinishedCallback)] (TaskThread::ShouldStopFlag& cancelled)
            {
                if (state == SessionState::loaded)
                {
                    CompileMessageList messageList;
                    bool ok = performer->link (messageList, settings, {});

                    if (cancelled)
                        return;

                    maxBlockSize = performer->getBlockSize();
                    SOUL_ASSERT (maxBlockSize != 0);
                    callback (messageList);

                    if (ok)
                        setState (SessionState::linked);
                }
            });

            return true;
        }